

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scope.cpp
# Opt level: O0

vector<unsigned_long,_std::allocator<unsigned_long>_> *
sort_permutation<unsigned_int>(vector<unsigned_int,_std::allocator<unsigned_int>_> *vec)

{
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this;
  size_type sVar1;
  reference pvVar2;
  iterator __comp;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RSI;
  allocator_type *in_RDI;
  CompareVec<unsigned_int> compareVec;
  int i;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *p;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffff48;
  CompareVec<unsigned_int> *in_stack_ffffffffffffff50;
  allocator_type *this_00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffff98;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffffa0;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_ffffffffffffffa8;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_ffffffffffffffb0;
  undefined4 local_28;
  
  this_00 = in_RDI;
  this = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
         std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(in_RSI);
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0xb03600);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(this,(size_type)this_00,in_RDI)
  ;
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0xb03623);
  for (local_28 = 0; sVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(in_RSI),
      (ulong)(long)local_28 < sVar1; local_28 = local_28 + 1) {
    in_stack_ffffffffffffff50 = (CompareVec<unsigned_int> *)(long)local_28;
    pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_00,
                        (long)local_28);
    *pvVar2 = (value_type)in_stack_ffffffffffffff50;
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  CompareVec<unsigned_int>::CompareVec(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_RDI);
  __comp = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                      in_stack_ffffffffffffff48);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffff48);
  CompareVec<unsigned_int>::CompareVec
            (in_stack_ffffffffffffff50,(CompareVec<unsigned_int> *)in_stack_ffffffffffffff48);
  std::
  sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,CompareVec<unsigned_int>>
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
             (CompareVec<unsigned_int> *)__comp._M_current);
  CompareVec<unsigned_int>::~CompareVec((CompareVec<unsigned_int> *)0xb03733);
  CompareVec<unsigned_int>::~CompareVec((CompareVec<unsigned_int> *)0xb03745);
  return (vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_RDI;
}

Assistant:

std::vector<std::size_t> sort_permutation(
    const std::vector<T>& vec)
{
    std::vector<std::size_t> p(vec.size());
    for (int i=0;i<vec.size();i++)
        p[i]=i;

    CompareVec<T> compareVec(vec);
    std::sort(p.begin(), p.end(),compareVec);
    return p;
}